

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsnames.c
# Opt level: O2

FT_Error FT_Get_Sfnt_Name(FT_Face face,FT_UInt idx,FT_SfntName *aname)

{
  undefined8 *puVar1;
  ushort uVar2;
  FT_Memory memory;
  FT_Stream stream;
  undefined8 uVar3;
  FT_Error FVar4;
  void *pvVar5;
  uint uVar6;
  FT_Error local_34;
  
  local_34 = 6;
  if (face == (FT_Face)0x0 || aname == (FT_SfntName *)0x0) {
    return 6;
  }
  if ((face->face_flags & 8) == 0) {
    return 6;
  }
  if (*(ushort *)&face[2].available_sizes <= idx) {
    return 6;
  }
  pvVar5 = face[2].generic.data;
  puVar1 = (undefined8 *)((long)pvVar5 + (ulong)idx * 0x20);
  uVar2 = *(ushort *)((long)pvVar5 + (ulong)idx * 0x20 + 8);
  uVar6 = (uint)uVar2;
  if ((ulong)uVar2 != 0) {
    if (puVar1[3] != 0) goto LAB_00137507;
    memory = face->memory;
    stream = face->stream;
    pvVar5 = ft_mem_realloc(memory,1,0,(ulong)uVar2,(void *)0x0,&local_34);
    puVar1[3] = pvVar5;
    if (local_34 == 0) {
      FVar4 = FT_Stream_Seek(stream,puVar1[2]);
      if ((FVar4 == 0) &&
         (FVar4 = FT_Stream_Read(stream,(FT_Byte *)puVar1[3],(ulong)*(ushort *)(puVar1 + 1)),
         FVar4 == 0)) {
        uVar6 = (uint)*(ushort *)(puVar1 + 1);
        goto LAB_00137507;
      }
      pvVar5 = (void *)puVar1[3];
    }
    if (pvVar5 != (void *)0x0) {
      (*memory->free)(memory,pvVar5);
    }
    puVar1[3] = 0;
    *(undefined2 *)(puVar1 + 1) = 0;
  }
  uVar6 = 0;
LAB_00137507:
  uVar3 = *puVar1;
  aname->platform_id = (short)uVar3;
  aname->encoding_id = (short)((ulong)uVar3 >> 0x10);
  aname->language_id = (short)((ulong)uVar3 >> 0x20);
  aname->name_id = (short)((ulong)uVar3 >> 0x30);
  aname->string = (FT_Byte *)puVar1[3];
  aname->string_len = uVar6;
  return 0;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_Sfnt_Name( FT_Face       face,
                    FT_UInt       idx,
                    FT_SfntName  *aname )
  {
    FT_Error  error = FT_ERR( Invalid_Argument );


    if ( aname && face && FT_IS_SFNT( face ) )
    {
      TT_Face  ttface = (TT_Face)face;


      if ( idx < (FT_UInt)ttface->num_names )
      {
        TT_Name  entry = ttface->name_table.names + idx;


        /* load name on demand */
        if ( entry->stringLength > 0 && !entry->string )
        {
          FT_Memory  memory = face->memory;
          FT_Stream  stream = face->stream;


          if ( FT_NEW_ARRAY  ( entry->string, entry->stringLength ) ||
               FT_STREAM_SEEK( entry->stringOffset )                ||
               FT_STREAM_READ( entry->string, entry->stringLength ) )
          {
            FT_FREE( entry->string );
            entry->stringLength = 0;
          }
        }

        aname->platform_id = entry->platformID;
        aname->encoding_id = entry->encodingID;
        aname->language_id = entry->languageID;
        aname->name_id     = entry->nameID;
        aname->string      = (FT_Byte*)entry->string;
        aname->string_len  = entry->stringLength;

        error = FT_Err_Ok;
      }
    }

    return error;
  }